

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

int64_t duckdb::Timestamp::GetEpochNanoSeconds(timestamp_t timestamp)

{
  bool bVar1;
  ConversionException *this;
  int64_t result;
  int64_t local_48;
  string local_40;
  
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(timestamp.value,1000,&local_48);
  if (bVar1) {
    return local_48;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not convert Timestamp(US) to Timestamp(NS)","");
  ConversionException::ConversionException(this,&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t Timestamp::GetEpochNanoSeconds(timestamp_t timestamp) {
	int64_t result;
	D_ASSERT(Timestamp::IsFinite(timestamp));
	if (!TryGetEpochNanoSeconds(timestamp, result)) {
		throw ConversionException("Could not convert Timestamp(US) to Timestamp(NS)");
	}
	return result;
}